

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

TPZManVector<TPZManVector<double,_10>,_20> * __thiscall
TPZManVector<TPZManVector<double,_10>,_20>::operator=
          (TPZManVector<TPZManVector<double,_10>,_20> *this,
          TPZManVector<TPZManVector<double,_10>,_20> *rval)

{
  long lVar1;
  double dVar2;
  uint uVar3;
  TPZManVector<double,_10> *pTVar4;
  long lVar5;
  ulong uVar6;
  TPZManVector<double,_10> *this_00;
  TPZManVector<double,_10> *pTVar7;
  TPZManVector<double,_10> local_a0;
  
  if (this != rval) {
    lVar1 = (rval->super_TPZVec<TPZManVector<double,_10>_>).fNElements;
    pTVar7 = (this->super_TPZVec<TPZManVector<double,_10>_>).fStore;
    pTVar4 = this->fExtAlloc;
    if (pTVar7 != pTVar4 && pTVar7 != (TPZManVector<double,_10> *)0x0) {
      dVar2 = pTVar7[-1].fExtAlloc[9];
      if (dVar2 != 0.0) {
        lVar5 = (long)dVar2 * 0x70;
        do {
          TPZManVector<double,_10>::~TPZManVector
                    ((TPZManVector<double,_10> *)((long)pTVar7[-1].fExtAlloc + lVar5 + -0x20));
          lVar5 = lVar5 + -0x70;
        } while (lVar5 != 0);
      }
      operator_delete__(pTVar7[-1].fExtAlloc + 9,(long)dVar2 * 0x70 | 8);
      (this->super_TPZVec<TPZManVector<double,_10>_>).fStore = (TPZManVector<double,_10> *)0x0;
      (this->super_TPZVec<TPZManVector<double,_10>_>).fNAlloc = 0;
    }
    if (lVar1 < 0x15) {
      if (lVar1 < 1) {
        uVar3 = 0;
      }
      else {
        pTVar7 = rval->fExtAlloc;
        this_00 = pTVar4;
        lVar5 = lVar1;
        do {
          TPZManVector<double,_10>::operator=(this_00,pTVar7);
          this_00 = this_00 + 1;
          pTVar7 = pTVar7 + 1;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
        uVar3 = (uint)lVar1;
      }
      if (uVar3 < 0x14) {
        uVar6 = (ulong)uVar3;
        pTVar7 = this->fExtAlloc + uVar6;
        do {
          uVar6 = uVar6 + 1;
          TPZManVector<double,_10>::TPZManVector(&local_a0,0);
          TPZManVector<double,_10>::operator=(pTVar7,&local_a0);
          TPZManVector<double,_10>::~TPZManVector(&local_a0);
          pTVar7 = pTVar7 + 1;
        } while ((int)uVar6 != 0x14);
      }
      lVar5 = 0;
    }
    else {
      pTVar4 = (rval->super_TPZVec<TPZManVector<double,_10>_>).fStore;
      lVar5 = lVar1;
    }
    (this->super_TPZVec<TPZManVector<double,_10>_>).fStore = pTVar4;
    (this->super_TPZVec<TPZManVector<double,_10>_>).fNAlloc = lVar5;
    (this->super_TPZVec<TPZManVector<double,_10>_>).fNElements = lVar1;
  }
  (rval->super_TPZVec<TPZManVector<double,_10>_>).fStore = (TPZManVector<double,_10> *)0x0;
  (rval->super_TPZVec<TPZManVector<double,_10>_>).fNElements = 0;
  (rval->super_TPZVec<TPZManVector<double,_10>_>).fNAlloc = 0;
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(TPZManVector< T, NumExtAlloc >&& rval) {
    // Checking auto assignment.
    if (this != &rval) {
      const int64_t nel = rval.NElements();
      //let us dispose of previously allocated memory
      if (this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = nullptr;
        this->fNAlloc = 0;
      }
      if (nel <= NumExtAlloc) {
        //we need to copy, unfortunately
        int i = 0;
        for(; i < nel; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNAlloc = 0;
        this->fNElements = nel;
      } else {
        this->fStore = rval.fStore;
        this->fNAlloc = nel;
        this->fNElements = nel;
      }
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
    return *this;
}